

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_ecb.c
# Opt level: O1

void beltECBStepD(void *buf,size_t count,void *state)

{
  if (0xf < count) {
    do {
      beltBlockDecr((octet *)buf,(u32 *)state);
      buf = (void *)((long)buf + 0x10);
      count = count - 0x10;
    } while (0xf < count);
  }
  if (count != 0) {
    memSwap((octet *)((long)buf + -0x10),buf,count);
    beltBlockDecr((octet *)((long)buf + -0x10),(u32 *)state);
    return;
  }
  return;
}

Assistant:

void beltECBStepD(void* buf, size_t count, void* state)
{
	belt_ecb_st* st = (belt_ecb_st*)state;
	ASSERT(count >= 16);
	ASSERT(memIsDisjoint2(buf, count, state, beltECB_keep()));
	// цикл по полным блокам
	while(count >= 16)
	{
		beltBlockDecr(buf, st->key);
		buf = (octet*)buf + 16;
		count -= 16;
	}
	// неполный блок? кража блока
	if (count)
	{
		memSwap((octet*)buf - 16, buf, count);
		beltBlockDecr((octet*)buf - 16, st->key);
	}
}